

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O3

void __thiscall
Parser_TokenizerBasics_Test::~Parser_TokenizerBasics_Test(Parser_TokenizerBasics_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, TokenizerBasics) {
    std::vector<std::string> errors;
    auto err = [&](const char *err, const FileLoc *) { errors.push_back(err); };

    {
        auto t =
            Tokenizer::CreateFromString("Shape \"sphere\" \"float radius\" [1]", err);
        ASSERT_TRUE(t.get() != nullptr);
        checkTokens(t.get(), {"Shape", "\"sphere\"", "\"float radius\"", "[", "1", "]"});
    }

    {
        auto t =
            Tokenizer::CreateFromString("Shape \"sphere\"\n\"float radius\" [1]", err);
        ASSERT_TRUE(t.get() != nullptr);
        checkTokens(t.get(), {"Shape", "\"sphere\"", "\"float radius\"", "[", "1", "]"});
    }

    {
        auto t = Tokenizer::CreateFromString(R"(
Shape"sphere" # foo bar [
"float radius\"" 1)",
                                             err);
        ASSERT_TRUE(t.get() != nullptr);
        checkTokens(t.get(),
                    {"Shape", "\"sphere\"", "# foo bar [", R"("float radius"")", "1"});
    }
}